

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O1

string * Catch::toString(string *__return_storage_ptr__,string *value)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer pcVar2;
  long lVar3;
  string *psVar4;
  char cVar5;
  IMutableContext *pIVar6;
  long *plVar7;
  undefined8 *puVar8;
  char *pcVar9;
  ulong *puVar10;
  size_type *psVar11;
  ulong uVar12;
  ulong uVar13;
  string subs;
  string s;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f8;
  ulong *local_d8;
  long local_d0;
  ulong local_c8 [2];
  ulong *local_b8;
  long local_b0;
  ulong local_a8;
  long lStack_a0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_98;
  long *local_78;
  undefined8 local_70;
  long local_68;
  undefined8 uStack_60;
  string *local_58;
  long *local_50 [2];
  long local_40 [2];
  
  local_98._M_dataplus._M_p = (pointer)&local_98.field_2;
  pcVar2 = (value->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_98,pcVar2,pcVar2 + value->_M_string_length);
  pIVar6 = getCurrentMutableContext();
  (*(pIVar6->super_IContext)._vptr_IContext[6])(&local_f8);
  cVar5 = (**(code **)(*(size_type *)local_f8._M_dataplus._M_p + 0x58))();
  local_58 = __return_storage_ptr__;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_f8._M_dataplus._M_p !=
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)0x0) {
    (**(code **)(*(size_type *)local_f8._M_dataplus._M_p + 0x18))();
  }
  if ((cVar5 != '\0') && (local_98._M_string_length != 0)) {
    paVar1 = &local_f8.field_2;
    uVar13 = 0;
    do {
      local_f8._M_string_length = 0;
      local_f8.field_2._M_local_buf[0] = '\0';
      local_f8._M_dataplus._M_p = (pointer)paVar1;
      if (local_98._M_dataplus._M_p[uVar13] == '\t') {
        pcVar9 = "\\t";
LAB_0013d560:
        std::__cxx11::string::_M_replace((ulong)&local_f8,0,(char *)0x0,(ulong)pcVar9);
      }
      else {
        pcVar9 = "\\n";
        if (local_98._M_dataplus._M_p[uVar13] == '\n') goto LAB_0013d560;
      }
      if (local_f8._M_string_length != 0) {
        std::__cxx11::string::substr((ulong)local_50,(ulong)&local_98);
        plVar7 = (long *)std::__cxx11::string::_M_append
                                   ((char *)local_50,(ulong)local_f8._M_dataplus._M_p);
        puVar10 = (ulong *)(plVar7 + 2);
        if ((ulong *)*plVar7 == puVar10) {
          local_a8 = *puVar10;
          lStack_a0 = plVar7[3];
          local_b8 = &local_a8;
        }
        else {
          local_a8 = *puVar10;
          local_b8 = (ulong *)*plVar7;
        }
        local_b0 = plVar7[1];
        *plVar7 = (long)puVar10;
        plVar7[1] = 0;
        *(undefined1 *)(plVar7 + 2) = 0;
        uVar13 = uVar13 + 1;
        std::__cxx11::string::substr((ulong)&local_d8,(ulong)&local_98);
        uVar12 = 0xf;
        if (local_b8 != &local_a8) {
          uVar12 = local_a8;
        }
        if (uVar12 < (ulong)(local_d0 + local_b0)) {
          uVar12 = 0xf;
          if (local_d8 != local_c8) {
            uVar12 = local_c8[0];
          }
          if (uVar12 < (ulong)(local_d0 + local_b0)) goto LAB_0013d63d;
          puVar8 = (undefined8 *)
                   std::__cxx11::string::replace((ulong)&local_d8,0,(char *)0x0,(ulong)local_b8);
        }
        else {
LAB_0013d63d:
          puVar8 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_b8,(ulong)local_d8);
        }
        plVar7 = puVar8 + 2;
        if ((long *)*puVar8 == plVar7) {
          local_68 = *plVar7;
          uStack_60 = puVar8[3];
          local_78 = &local_68;
        }
        else {
          local_68 = *plVar7;
          local_78 = (long *)*puVar8;
        }
        local_70 = puVar8[1];
        *puVar8 = plVar7;
        puVar8[1] = 0;
        *(undefined1 *)plVar7 = 0;
        std::__cxx11::string::operator=((string *)&local_98,(string *)&local_78);
        if (local_78 != &local_68) {
          operator_delete(local_78,local_68 + 1);
        }
        if (local_d8 != local_c8) {
          operator_delete(local_d8,local_c8[0] + 1);
        }
        if (local_b8 != &local_a8) {
          operator_delete(local_b8,local_a8 + 1);
        }
        if (local_50[0] != local_40) {
          operator_delete(local_50[0],local_40[0] + 1);
        }
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_f8._M_dataplus._M_p != paVar1) {
        operator_delete(local_f8._M_dataplus._M_p,
                        CONCAT71(local_f8.field_2._M_allocated_capacity._1_7_,
                                 local_f8.field_2._M_local_buf[0]) + 1);
      }
      uVar13 = uVar13 + 1;
    } while (uVar13 < local_98._M_string_length);
  }
  std::operator+(&local_f8,"\"",&local_98);
  plVar7 = (long *)std::__cxx11::string::append((char *)&local_f8);
  psVar4 = local_58;
  (local_58->_M_dataplus)._M_p = (pointer)&local_58->field_2;
  psVar11 = (size_type *)(plVar7 + 2);
  if ((size_type *)*plVar7 == psVar11) {
    lVar3 = plVar7[3];
    (local_58->field_2)._M_allocated_capacity = *psVar11;
    *(long *)((long)&local_58->field_2 + 8) = lVar3;
  }
  else {
    (local_58->_M_dataplus)._M_p = (pointer)*plVar7;
    (local_58->field_2)._M_allocated_capacity = *psVar11;
  }
  local_58->_M_string_length = plVar7[1];
  *plVar7 = (long)psVar11;
  plVar7[1] = 0;
  *(undefined1 *)(plVar7 + 2) = 0;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_f8._M_dataplus._M_p != &local_f8.field_2) {
    operator_delete(local_f8._M_dataplus._M_p,
                    CONCAT71(local_f8.field_2._M_allocated_capacity._1_7_,
                             local_f8.field_2._M_local_buf[0]) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_98._M_dataplus._M_p != &local_98.field_2) {
    operator_delete(local_98._M_dataplus._M_p,local_98.field_2._M_allocated_capacity + 1);
  }
  return psVar4;
}

Assistant:

std::string toString( std::string const& value ) {
    std::string s = value;
    if( getCurrentContext().getConfig()->showInvisibles() ) {
        for(size_t i = 0; i < s.size(); ++i ) {
            std::string subs;
            switch( s[i] ) {
            case '\n': subs = "\\n"; break;
            case '\t': subs = "\\t"; break;
            default: break;
            }
            if( !subs.empty() ) {
                s = s.substr( 0, i ) + subs + s.substr( i+1 );
                ++i;
            }
        }
    }
    return "\"" + s + "\"";
}